

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.c
# Opt level: O2

void file_set_attr(filetype_t type,int tmp)

{
  long lVar1;
  file_entry_t *pfVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  long lVar6;
  char cVar7;
  
  pfVar2 = cur;
  pcVar4 = (cur->file).name;
  lVar6 = -1;
  do {
    lVar1 = lVar6 + 1;
    lVar6 = lVar6 + 1;
  } while (pcVar4[lVar1] != '\0');
  cVar7 = '\0';
  while (cVar7 != '.') {
    if (lVar6 == 0) goto LAB_00107020;
    lVar1 = lVar6 + -1;
    lVar6 = lVar6 + -1;
    cVar7 = pcVar4[lVar1];
  }
  pcVar4[lVar6] = '\0';
  pcVar4 = (pfVar2->file).name;
LAB_00107020:
  sVar3 = strlen(pcVar4);
  pcVar4 = (char *)mrealloc(pcVar4,sVar3 + 3);
  pfVar2 = cur;
  (cur->file).name = pcVar4;
  do {
    pcVar5 = pcVar4;
    pcVar4 = pcVar5 + 1;
  } while (*pcVar5 != '\0');
  *pcVar5 = '.';
  pcVar5[1] = "ciso"[type];
  pcVar5[2] = '\0';
  (pfVar2->file).type = type;
  (pfVar2->file).tmp = tmp;
  return;
}

Assistant:

void file_set_attr(filetype_t type, int tmp)
{
    char* p = cur->file.name;
    while (*p)
        ++p;
    while (*p != '.' && p != cur->file.name)
        --p;

    if (*p == '.')
        *p = 0;

    cur->file.name = (char*)mrealloc(cur->file.name,
                                     strlen(cur->file.name) + 3);

    p = cur->file.name;
    while (*p != 0)
        ++p;

    *p++ = '.';
    *p++ = "ciso"[type];
    *p = 0;

    cur->file.type = type;
    cur->file.tmp = tmp;
}